

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::getKappa(Highs *this,double *kappa,bool exact,bool report)

{
  byte in_CL;
  byte in_DL;
  double *in_RSI;
  Highs *in_RDI;
  double dVar1;
  bool in_stack_000001fe;
  bool in_stack_000001ff;
  HighsLp *in_stack_00000200;
  HEkk *in_stack_00000208;
  string *method_name;
  undefined1 local_41 [39];
  byte local_1a;
  byte local_19;
  double *local_18;
  HighsStatus local_4;
  
  local_19 = in_DL & 1;
  local_1a = in_CL & 1;
  if (((in_RDI->ekk_instance_).status_.has_invert & 1U) == 0) {
    method_name = (string *)local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_41 + 1),"getBasisInverseRow",(allocator *)method_name);
    local_4 = invertRequirementError(in_RDI,method_name);
    std::__cxx11::string::~string((string *)(local_41 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_41);
  }
  else {
    local_18 = in_RSI;
    dVar1 = HEkk::computeBasisCondition
                      (in_stack_00000208,in_stack_00000200,in_stack_000001ff,in_stack_000001fe);
    *local_18 = dVar1;
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::getKappa(double& kappa, const bool exact,
                            const bool report) const {
  if (!ekk_instance_.status_.has_invert)
    return invertRequirementError("getBasisInverseRow");
  kappa = ekk_instance_.computeBasisCondition(this->model_.lp_, exact, report);
  return HighsStatus::kOk;
}